

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgRuleWavelet.cpp
# Opt level: O3

double __thiscall TasGrid::RuleWavelet::eval_cubic<1>(RuleWavelet *this,int point,double x)

{
  double *pdVar1;
  double *pdVar2;
  pointer pvVar3;
  pointer pdVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  
  if (((point == 0) && (x == 0.0)) && (!NAN(x))) {
    return 0.0;
  }
  if (4 < point) {
    uVar8 = point - 1U;
    iVar12 = -4;
    do {
      iVar11 = iVar12;
      uVar8 = (int)uVar8 >> 1;
      iVar12 = iVar11 + 1;
    } while (1 < uVar8);
    iVar11 = iVar11 + 4;
    if (iVar11 != 2) {
      if (iVar11 != 1) {
        iVar11 = 2 << ((byte)iVar11 & 0x1f);
        uVar8 = (int)(point - 1U) % iVar11;
        dVar17 = ldexp(1.0,iVar12);
        if ((int)uVar8 < 5) {
          dVar19 = (x + 1.0) * dVar17 + -1.0;
          dVar18 = 0.0;
          if (ABS(dVar19) <= 1.0) {
            pvVar3 = (this->data).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            iVar12 = this->num_data_points;
            lVar7 = (long)(int)(iVar12 * uVar8) * 8 +
                    *(long *)&pvVar3[4].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data;
            lVar10 = *(long *)&(pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                               .super__Vector_impl_data;
            uVar9 = 0;
            if (2 < iVar12) {
              uVar14 = iVar12 - 1;
              do {
                uVar15 = (int)((int)uVar9 + uVar14) / 2;
                if (*(double *)(lVar10 + (long)(int)uVar15 * 8) <= dVar19) {
                  uVar9 = (ulong)uVar15;
                  uVar15 = uVar14;
                }
                uVar14 = uVar15;
                iVar6 = (int)uVar9;
              } while (1 < (int)(uVar14 - iVar6));
LAB_001c5a4b:
              dVar18 = 0.0;
              if (iVar6 == -1) goto LAB_001c5e9f;
              if (iVar6 < 1) {
LAB_001c5dce:
                uVar9 = 0;
              }
              else {
                iVar13 = iVar12 + -3;
                if (iVar6 - iVar12 < -2) {
                  iVar13 = iVar6;
                }
                uVar9 = (ulong)(iVar13 + -1);
              }
            }
LAB_001c5dd0:
            pdVar1 = (double *)(lVar10 + uVar9 * 8);
            pdVar2 = (double *)(lVar7 + uVar9 * 8);
            dVar18 = dVar19 - *pdVar1;
            dVar20 = dVar19 - pdVar1[1];
            pdVar4 = (this->cachexs).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            dVar21 = dVar19 - pdVar1[2];
            dVar19 = dVar19 - pdVar1[3];
            dVar18 = (dVar20 * dVar21 + dVar18 * dVar21 + dVar18 * dVar20) *
                     pdVar4[uVar9 * 4 + 3] * pdVar2[3] +
                     (dVar20 * dVar19 + dVar18 * dVar19 + dVar18 * dVar20) *
                     pdVar4[uVar9 * 4 + 2] * pdVar2[2] +
                     (dVar19 * dVar21 + dVar18 * dVar19 + dVar18 * dVar21) *
                     pdVar4[uVar9 * 4 + 1] * pdVar2[1] +
                     (dVar19 * dVar21 + dVar20 * dVar19 + dVar20 * dVar21) *
                     pdVar4[uVar9 * 4] * *pdVar2;
          }
        }
        else if ((int)(uVar8 - iVar11) < -5) {
          dVar19 = (x + 1.0) * dVar17 + -1.0 + (double)(int)(uVar8 - 5) * -0.125;
          dVar18 = 0.0;
          if (ABS(dVar19) <= 1.0) {
            pvVar3 = (this->data).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            iVar12 = this->num_data_points;
            lVar7 = (long)iVar12 * 0x28 +
                    *(long *)&pvVar3[4].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data;
            lVar10 = *(long *)&(pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                               .super__Vector_impl_data;
            iVar6 = 0;
            uVar9 = 0;
            if (2 < iVar12) {
              iVar13 = iVar12 + -1;
              do {
                iVar16 = (iVar6 + iVar13) / 2;
                iVar5 = iVar16;
                if (*(double *)(lVar10 + (long)iVar16 * 8) <= dVar19) {
                  iVar5 = iVar13;
                  iVar6 = iVar16;
                }
                iVar13 = iVar5;
              } while (1 < iVar13 - iVar6);
              if (iVar6 == -1) goto LAB_001c5e9f;
              if (iVar6 < 1) goto LAB_001c5dce;
              iVar13 = iVar12 + -3;
              if (iVar6 - iVar12 < -2) {
                iVar13 = iVar6;
              }
              uVar9 = (ulong)(iVar13 + -1);
            }
            goto LAB_001c5dd0;
          }
        }
        else {
          dVar19 = (1.0 - x) * dVar17 + -1.0;
          dVar18 = 0.0;
          if (ABS(dVar19) <= 1.0) {
            pvVar3 = (this->data).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            iVar12 = this->num_data_points;
            lVar7 = (long)(int)((~uVar8 + iVar11) * iVar12) * 8 +
                    *(long *)&pvVar3[4].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data;
            lVar10 = *(long *)&(pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                               .super__Vector_impl_data;
            uVar9 = 0;
            if (2 < iVar12) {
              uVar14 = iVar12 - 1;
              do {
                uVar15 = (int)((int)uVar9 + uVar14) / 2;
                if (*(double *)(lVar10 + (long)(int)uVar15 * 8) <= dVar19) {
                  uVar9 = (ulong)uVar15;
                  uVar15 = uVar14;
                }
                uVar14 = uVar15;
                iVar6 = (int)uVar9;
              } while (1 < (int)(uVar14 - iVar6));
              goto LAB_001c5a4b;
            }
            goto LAB_001c5dd0;
          }
        }
LAB_001c5e9f:
        if (-6 < (int)(uVar8 - iVar11)) {
          dVar17 = -dVar17;
        }
        goto LAB_001c5eb0;
      }
      iVar12 = point;
      dVar17 = x;
      if (6 < point) {
        iVar12 = 0xd - point;
        dVar17 = -x;
      }
      dVar18 = 0.0;
      if (ABS(x) <= 1.0) {
        pvVar3 = (this->data).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar11 = this->num_data_points;
        lVar7 = (long)((iVar12 + -5) * iVar11) * 8 +
                *(long *)&pvVar3[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data;
        lVar10 = *(long *)&(pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data;
        uVar9 = 0;
        if (2 < iVar11) {
          uVar8 = iVar11 - 1;
          do {
            uVar14 = (int)((int)uVar9 + uVar8) / 2;
            if (*(double *)(lVar10 + (long)(int)uVar14 * 8) <= dVar17) {
              uVar9 = (ulong)uVar14;
              uVar14 = uVar8;
            }
            uVar8 = uVar14;
            iVar12 = (int)uVar9;
          } while (1 < (int)(uVar8 - iVar12));
          if (iVar12 == -1) goto LAB_001c5cdb;
          if (iVar12 < 1) {
            uVar9 = 0;
          }
          else {
            iVar6 = iVar11 + -3;
            if (iVar12 - iVar11 < -2) {
              iVar6 = iVar12;
            }
            uVar9 = (ulong)(iVar6 + -1);
          }
        }
        pdVar1 = (double *)(lVar10 + uVar9 * 8);
        pdVar2 = (double *)(lVar10 + 0x10 + uVar9 * 8);
        dVar19 = dVar17 - *pdVar1;
        dVar20 = dVar17 - pdVar1[1];
        pdVar4 = (this->cachexs).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        dVar18 = dVar17 - *pdVar2;
        dVar17 = dVar17 - pdVar2[1];
        dVar18 = (dVar20 * dVar18 + dVar19 * dVar18 + dVar19 * dVar20) *
                 pdVar4[uVar9 * 4 + 3] * *(double *)(lVar7 + 0x18 + uVar9 * 8) +
                 (dVar20 * dVar17 + dVar19 * dVar17 + dVar19 * dVar20) *
                 pdVar4[uVar9 * 4 + 2] * *(double *)(lVar7 + 0x10 + uVar9 * 8) +
                 (dVar17 * dVar18 + dVar19 * dVar17 + dVar19 * dVar18) *
                 pdVar4[uVar9 * 4 + 1] * *(double *)(lVar7 + 8 + uVar9 * 8) +
                 (dVar17 * dVar18 + dVar20 * dVar17 + dVar20 * dVar18) *
                 pdVar4[uVar9 * 4] * *(double *)(lVar7 + uVar9 * 8);
      }
LAB_001c5cdb:
      if (point < 7) {
        return dVar18;
      }
      goto LAB_001c5dc1;
    }
    iVar12 = point;
    dVar17 = x;
    if (0xc < point) {
      iVar12 = 0x19 - point;
      dVar17 = -x;
    }
    dVar18 = 0.0;
    if (ABS(x) <= 1.0) {
      pvVar3 = (this->data).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar11 = this->num_data_points;
      lVar7 = (long)((iVar12 + -9) * iVar11) * 8 +
              *(long *)&pvVar3[3].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data;
      lVar10 = *(long *)&(pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data;
      uVar9 = 0;
      if (2 < iVar11) {
        uVar8 = iVar11 - 1;
        do {
          uVar14 = (int)((int)uVar9 + uVar8) / 2;
          if (*(double *)(lVar10 + (long)(int)uVar14 * 8) <= dVar17) {
            uVar9 = (ulong)uVar14;
            uVar14 = uVar8;
          }
          uVar8 = uVar14;
          iVar12 = (int)uVar9;
        } while (1 < (int)(uVar8 - iVar12));
        if (iVar12 == -1) goto LAB_001c5db8;
        if (iVar12 < 1) {
          uVar9 = 0;
        }
        else {
          iVar6 = iVar11 + -3;
          if (iVar12 - iVar11 < -2) {
            iVar6 = iVar12;
          }
          uVar9 = (ulong)(iVar6 + -1);
        }
      }
      pdVar1 = (double *)(lVar10 + uVar9 * 8);
      pdVar2 = (double *)(lVar10 + 0x10 + uVar9 * 8);
      dVar19 = dVar17 - *pdVar1;
      dVar20 = dVar17 - pdVar1[1];
      pdVar4 = (this->cachexs).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar18 = dVar17 - *pdVar2;
      dVar17 = dVar17 - pdVar2[1];
      dVar18 = (dVar20 * dVar18 + dVar19 * dVar18 + dVar19 * dVar20) *
               pdVar4[uVar9 * 4 + 3] * *(double *)(lVar7 + 0x18 + uVar9 * 8) +
               (dVar20 * dVar17 + dVar19 * dVar17 + dVar19 * dVar20) *
               pdVar4[uVar9 * 4 + 2] * *(double *)(lVar7 + 0x10 + uVar9 * 8) +
               (dVar17 * dVar18 + dVar19 * dVar17 + dVar19 * dVar18) *
               pdVar4[uVar9 * 4 + 1] * *(double *)(lVar7 + 8 + uVar9 * 8) +
               (dVar17 * dVar18 + dVar20 * dVar17 + dVar20 * dVar18) *
               pdVar4[uVar9 * 4] * *(double *)(lVar7 + uVar9 * 8);
    }
LAB_001c5db8:
    if (point < 0xd) {
      return dVar18;
    }
LAB_001c5dc1:
    return -dVar18;
  }
  if (point == 4) {
    point = 3;
LAB_001c56a2:
    x = -x;
    dVar17 = -1.0;
  }
  else {
    if (point == 2) {
      point = 1;
      goto LAB_001c56a2;
    }
    dVar17 = 1.0;
  }
  dVar18 = 0.0;
  if (ABS(x) <= 1.0) {
    pvVar3 = (this->data).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar12 = this->num_data_points;
    lVar7 = (long)(((point - (point + 1 >> 0x1f)) + 1 >> 1) * iVar12) * 8 +
            *(long *)&pvVar3[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data;
    lVar10 = *(long *)&(pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data;
    uVar9 = 0;
    if (2 < iVar12) {
      uVar8 = iVar12 - 1;
      do {
        uVar14 = (int)((int)uVar9 + uVar8) / 2;
        if (*(double *)(lVar10 + (long)(int)uVar14 * 8) <= x) {
          uVar9 = (ulong)uVar14;
          uVar14 = uVar8;
        }
        uVar8 = uVar14;
        iVar11 = (int)uVar9;
      } while (1 < (int)(uVar8 - iVar11));
      if (iVar11 == -1) goto LAB_001c5eb0;
      if (iVar11 < 1) {
        uVar9 = 0;
      }
      else {
        iVar6 = iVar12 + -3;
        if (iVar11 - iVar12 < -2) {
          iVar6 = iVar11;
        }
        uVar9 = (ulong)(iVar6 + -1);
      }
    }
    pdVar1 = (double *)(lVar10 + uVar9 * 8);
    pdVar2 = (double *)(lVar10 + 0x10 + uVar9 * 8);
    dVar18 = x - *pdVar1;
    dVar19 = x - pdVar1[1];
    pdVar4 = (this->cachexs).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar20 = x - *pdVar2;
    dVar21 = x - pdVar2[1];
    dVar18 = (dVar19 * dVar20 + dVar18 * dVar20 + dVar18 * dVar19) *
             pdVar4[uVar9 * 4 + 3] * *(double *)(lVar7 + 0x18 + uVar9 * 8) +
             (dVar19 * dVar21 + dVar18 * dVar21 + dVar18 * dVar19) *
             pdVar4[uVar9 * 4 + 2] * *(double *)(lVar7 + 0x10 + uVar9 * 8) +
             (dVar21 * dVar20 + dVar18 * dVar21 + dVar18 * dVar20) *
             pdVar4[uVar9 * 4 + 1] * *(double *)(lVar7 + 8 + uVar9 * 8) +
             (dVar21 * dVar20 + dVar19 * dVar21 + dVar19 * dVar20) *
             pdVar4[uVar9 * 4] * *(double *)(lVar7 + uVar9 * 8);
  }
LAB_001c5eb0:
  return dVar17 * dVar18;
}

Assistant:

inline double RuleWavelet::eval_cubic(int point, double x) const{
    // Helps stabilize numerical errors.
    if (point == 0 and x == 0.0 and mode == 1) return 0.0;

    // Evaluates a third order wavelet at a given point x.
    double sgn = 1.0;
    if (point < 5){ // Scaling functions
        if (point == 2){ // Reflect across y-axis
            point = 1;
            sgn = -1.0;
            x = -x;
        }else if(point == 4){
            point = 3;
            sgn = -1.0;
            x = -x;
        }
        const double *phi = &(data[1][((point+1)/2) * num_data_points]);
        return (mode == 0 ? interpolate<mode>(phi, x) : sgn * interpolate<mode>(phi, x));
    }
    int l = Maths::intlog2(point - 1);

    if(l == 2){
        if (point > 6){
            // i.e. 7 or 8
            // These wavelets are reflections across the y-axis of 6 & 5, respectively
            x = -x;
            sgn = -1.0;
            point = 13 - point;
        }
        point -= 5;
        const double *phi = &data[2][point*num_data_points];
        return (mode == 0 ? interpolate<mode>(phi, x) : sgn * interpolate<mode>(phi, x));
    }else if(l == 3){
        if (point > 12){
            // i.e. 13, 14, 15, 16
            // These wavelets are reflections of 12, 11, 10, 9, respectively
            x = -x;
            sgn = -1.0;
            point = 25 - point;
        }
        point -= 9;
        const double *phi = &data[3][point*num_data_points];
        return (mode == 0 ? interpolate<mode>(phi, x) : sgn * interpolate<mode>(phi, x));
    }
    // Standard lifted wavelets.
    int subindex = (point - 1) % (1 << l);
    double scale = pow(2,l-4);
    double value;
    if (subindex < 5){
        // Left boundary wavelet.
        value = interpolate<mode>(&data[4][subindex*num_data_points], scale * (x + 1.) - 1.);
    } else if ((1 << l) - 1 - subindex < 5){
        // Right boundary wavelet.
        value = interpolate<mode>(&data[4][((1 << l) - subindex - 1)*num_data_points], scale * (1. - x) - 1.);
    } else {
        // Central wavelets.
        double shift = 0.125 * (double (subindex - 5));
        value = interpolate<mode>(&data[4][5*num_data_points], scale * (x + 1.) -1. - shift);
    }
    // Adjust for the chain rule multiplier.
    if (mode == 1) value *= ((1 << l) - 1 - subindex < 5) ? -scale : scale;

    return value;
}